

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall Clasp::Solver::updateBranch(Solver *this,uint32 n)

{
  size_type sVar1;
  uint uVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  uint local_1c;
  Fill<unsigned_int> local_18;
  
  sVar1 = (this->levels_).super_type.ebo_.size;
  uVar2 = (this->cflStamp_).ebo_.size;
  if ((int)sVar1 < (int)(uVar2 - 1)) {
    puVar3 = (this->cflStamp_).ebo_.buf;
    uVar5 = (this->cflStamp_).ebo_.size;
    iVar4 = (sVar1 - uVar2) + 1;
    do {
      uVar5 = uVar5 - 1;
      n = n + puVar3[uVar5];
      (this->cflStamp_).ebo_.size = uVar5;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  else if ((int)uVar2 <= (int)sVar1) {
    local_18.val_ = &local_1c;
    local_1c = 0;
    bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::
    insert_impl<unsigned_int,bk_lib::detail::Fill<unsigned_int>>
              ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)&this->cflStamp_,
               (this->cflStamp_).ebo_.buf + uVar2,sVar1 - (uVar2 - 1),&local_18);
  }
  puVar3 = (this->cflStamp_).ebo_.buf + ((this->cflStamp_).ebo_.size - 1);
  *puVar3 = *puVar3 + n;
  return;
}

Assistant:

void Solver::updateBranch(uint32 n) {
	int32 dl = (int32)decisionLevel(), xl = static_cast<int32>(cflStamp_.size())-1;
	if      (xl > dl) { do { n += cflStamp_.back(); cflStamp_.pop_back(); } while (--xl != dl); }
	else if (dl > xl) { cflStamp_.insert(cflStamp_.end(), dl - xl, 0); }
	cflStamp_.back() += n;
}